

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

string_view_type __thiscall
jessilib::app_parameters::get_value
          (app_parameters *this,string_view_type in_key,string_view_type in_default)

{
  string_view_type in_default_00;
  string_view_type in_key_00;
  bool bVar1;
  pointer pvVar2;
  string_view_type sVar3;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
  local_48;
  const_iterator result;
  app_parameters *this_local;
  string_view_type in_default_local;
  string_view_type in_key_local;
  char8_t *local_10;
  
  in_default_local._M_len = (size_t)in_default._M_str;
  in_default_local._M_str = (char8_t *)in_key._M_len;
  result.
  super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
               )this;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
       ::find(&this->m_arg_values,(key_type *)&in_default_local._M_str);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
       ::end(&this->m_arg_values);
  bVar1 = std::__detail::operator==(&local_48,&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_key_00._M_str = in_key._M_str;
    in_key_00._M_len = (size_t)in_default_local._M_str;
    in_default_00._M_str = (char8_t *)in_default_local._M_len;
    in_default_00._M_len = in_default._M_len;
    join_0x00000010_0x00000000_ = get_env_value(this,in_key_00,in_default_00);
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_false,_true>
                           *)&local_48);
    join_0x00000010_0x00000000_ =
         std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&pvVar2->second);
  }
  sVar3._M_len = (size_t)in_key_local._M_str;
  sVar3._M_str = local_10;
  return sVar3;
}

Assistant:

app_parameters::string_view_type app_parameters::get_value(string_view_type in_key, string_view_type in_default) const {
	// Try args first
	auto result = m_arg_values.find(in_key);
	if (result != m_arg_values.end()) {
		return result->second;
	}

	// Fallback to trying env
	return get_env_value(in_key, in_default);
}